

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

real __thiscall fasttext::Model::binaryLogistic(Model *this,int32_t target,bool label,real lr)

{
  float a;
  undefined1 auVar1 [16];
  long i;
  undefined1 auVar2 [16];
  real rVar3;
  float fVar4;
  
  i = (long)target;
  rVar3 = Matrix::dotRow((this->wo_).
                         super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         &this->hidden_,i);
  fVar4 = 0.0;
  if (-8.0 <= rVar3) {
    if (rVar3 <= 8.0) {
      fVar4 = (this->t_sigmoid_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[(long)((rVar3 + 8.0) * 512.0 * 0.125 * 0.5)];
    }
    else {
      fVar4 = 1.0;
    }
  }
  a = ((float)label - fVar4) * lr;
  Vector::addRow(&this->grad_,
                 (this->wo_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 ,i,a);
  Matrix::addRow((this->wo_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 ,&this->hidden_,i,a);
  if (!label) {
    fVar4 = 1.0 - fVar4;
  }
  auVar2 = ZEXT816(0);
  if (fVar4 <= 1.0) {
    auVar2 = ZEXT416((uint)(this->t_log_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start[(long)(fVar4 * 512.0)]);
  }
  auVar1._8_4_ = 0x80000000;
  auVar1._0_8_ = 0x8000000080000000;
  auVar1._12_4_ = 0x80000000;
  auVar2 = vxorps_avx512vl(auVar2,auVar1);
  return auVar2._0_4_;
}

Assistant:

real Model::binaryLogistic(int32_t target, bool label, real lr) {
	real score = sigmoid(wo_->dotRow(hidden_, target));
	real alpha = lr * (real(label) - score);
	grad_.addRow(*wo_, target, alpha);
	wo_->addRow(hidden_, target, alpha);
	if (label) {
		return -log(score);
	} else {
		return -log(1.0 - score);
	}
}